

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O2

FT_Error af_latin_metrics_init(AF_LatinMetrics metrics,FT_Face face)

{
  char *pcVar1;
  AF_WidthRec *table;
  long lVar2;
  ushort uVar3;
  FT_GlyphSlot_conflict pFVar4;
  FT_Vector *pFVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long *plVar9;
  AF_Segment_conflict pAVar10;
  uint uVar11;
  bool bVar12;
  AF_StyleClass *ppAVar13;
  char cVar14;
  FT_Error FVar15;
  FT_UInt count;
  uint uVar16;
  void *pvVar17;
  AF_StyleMetrics_conflict pAVar18;
  FT_ULong FVar19;
  char *pcVar20;
  AF_LatinMetricsRec *pAVar21;
  AF_Segment_conflict pAVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  AF_Segment_conflict pAVar27;
  ushort uVar28;
  uint uVar29;
  AF_LatinBlueRec *pAVar30;
  uint uVar31;
  FT_Memory pFVar32;
  long lVar33;
  FT_UInt count_00;
  int iVar34;
  AF_StyleMetrics_conflict metrics_00;
  long lVar35;
  long lVar36;
  AF_LatinMetricsRec *metrics_01;
  long *plVar37;
  long *plVar38;
  uint uVar39;
  ulong uVar40;
  long lVar41;
  long *plVar42;
  FT_Pos *pFVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  uint uVar47;
  ulong uVar48;
  uint uVar49;
  uint uVar50;
  AF_Blue_StringRec *pAVar51;
  long lVar52;
  FT_CharMap charmap;
  ulong uVar53;
  bool bVar54;
  bool bVar55;
  uint local_c3d0;
  uint local_c3cc;
  uint local_c3a4;
  uint local_c3a0;
  uint local_c37c;
  uint num_idx_1;
  AF_LatinBlueRec *local_c340;
  char *local_c338;
  ulong local_c330;
  FT_CharMap local_c328;
  ulong local_c320;
  long local_c318;
  ulong local_c310;
  ulong local_c308;
  long local_c300;
  long local_c2f8;
  long local_c2f0;
  FT_Long y_offset;
  long local_c2e0 [9];
  AF_GlyphHintsRec hints [1];
  AF_LatinMetricsRec dummy [1];
  
  charmap = face->charmap;
  metrics->units_per_em = (uint)face->units_per_EM;
  FVar15 = FT_Select_Charmap(face,FT_ENCODING_UNICODE);
  if (FVar15 == 0) {
    pFVar32 = face->memory;
    local_c328 = charmap;
    memset(&hints[0].x_scale,0,0x1430);
    metrics->axis[0].width_count = 0;
    metrics->axis[1].width_count = 0;
    pAVar18 = (AF_StyleMetrics_conflict)
              af_script_classes[((metrics->root).style_class)->script]->standard_charstring;
    hints[0].memory = pFVar32;
    pvVar17 = (void *)hb_buffer_create();
    do {
      cVar14 = *(char *)&pAVar18->style_class;
      metrics_00 = pAVar18;
      FVar19 = 0;
      if (cVar14 == '\0') break;
      while (cVar14 == ' ') {
        ppAVar13 = &metrics_00->style_class;
        metrics_00 = (AF_StyleMetrics_conflict)((long)&metrics_00->style_class + 1);
        cVar14 = *(char *)((long)ppAVar13 + 1);
      }
      pAVar18 = (AF_StyleMetrics_conflict)
                af_shaper_get_cluster((char *)metrics_00,&metrics->root,pvVar17,(uint *)dummy);
    } while ((1 < (uint)dummy[0].root.style_class) ||
            (FVar19 = af_shaper_get_elem(metrics_00,pvVar17,0,(FT_Long *)0x0,(FT_Long *)0x0),
            FVar19 == 0));
    hb_buffer_destroy(pvVar17);
    if ((FVar19 != 0) &&
       ((FVar15 = FT_Load_Glyph(face,(FT_UInt)FVar19,1), FVar15 == 0 &&
        (pFVar4 = face->glyph, 0 < (pFVar4->outline).n_points)))) {
      memset(dummy,0,0x8fe0);
      dummy[0].units_per_em = metrics->units_per_em;
      dummy[0].root.scaler.x_scale = 0x10000;
      dummy[0].root.scaler.y_scale = 0x10000;
      dummy[0].root.scaler.x_delta = 0;
      dummy[0].root.scaler.y_delta = 0;
      hints[0].scaler_flags = 0;
      hints[0].metrics = &dummy[0].root;
      dummy[0].root.scaler.face = face;
      FVar15 = af_glyph_hints_reload(hints,&pFVar4->outline);
      if (FVar15 == 0) {
        for (lVar33 = 0; lVar33 != 2; lVar33 = lVar33 + 1) {
          FVar15 = af_latin_hints_compute_segments(hints,(AF_Dimension)lVar33);
          if (FVar15 != 0) break;
          af_latin_hints_link_segments(hints,0,(AF_WidthRec *)0x0,(AF_Dimension)lVar33);
          pAVar22 = hints[0].axis[lVar33].segments;
          pAVar27 = pAVar22 + hints[0].axis[lVar33].num_segments;
          table = metrics->axis[lVar33].widths;
          uVar25 = 0;
          for (; y_offset._0_4_ = (uint)uVar25, pAVar22 < pAVar27; pAVar22 = pAVar22 + 1) {
            pAVar10 = pAVar22->link;
            uVar53 = uVar25;
            if ((pAVar10 != (AF_Segment_conflict)0x0) &&
               (((uint)y_offset < 0x10 && pAVar22 < pAVar10) && pAVar22 == pAVar10->link)) {
              iVar34 = (int)pAVar22->pos - (int)pAVar10->pos;
              uVar3 = (ushort)iVar34;
              uVar28 = -uVar3;
              if (0 < iVar34) {
                uVar28 = uVar3;
              }
              uVar53 = (ulong)((uint)y_offset + 1);
              table[uVar25].org = (ulong)uVar28;
            }
            uVar25 = uVar53;
          }
          af_sort_and_quantize_widths((FT_UInt *)&y_offset,table,(ulong)dummy[0].units_per_em / 100)
          ;
          metrics->axis[lVar33].width_count = (uint)y_offset;
        }
      }
    }
    for (lVar33 = 0x1f8; lVar33 != 0x9188; lVar33 = lVar33 + 0x47c8) {
      if (*(int *)((long)metrics + lVar33 + -0x198) == 0) {
        uVar25 = (ulong)metrics->units_per_em * 0x32 >> 0xb;
      }
      else {
        uVar25 = *(ulong *)((long)metrics + lVar33 + -400);
      }
      *(long *)((long)(metrics->axis[0].widths + -5) + lVar33) = (long)uVar25 / 5;
      *(ulong *)((long)metrics->axis[0].widths + lVar33 + -0x70) = uVar25;
      *(undefined1 *)((long)metrics->axis[0].widths + lVar33 + -0x68) = 0;
    }
    af_glyph_hints_done(hints);
    pAVar51 = af_blue_stringsets + ((metrics->root).style_class)->blue_stringset;
    local_c310 = (ulong)metrics->units_per_em / 0xe;
    pvVar17 = (void *)hb_buffer_create();
    local_c340 = metrics->axis[1].blues;
    while( true ) {
      uVar16 = 1;
      if ((ulong)pAVar51->string == 0x1429) break;
      local_c338 = af_blue_strings + pAVar51->string;
      lVar36 = 0;
      lVar33 = 0;
      pAVar18 = (AF_StyleMetrics_conflict)0x0;
      uVar25 = 0;
      while( true ) {
        count_00 = (FT_UInt)pAVar18;
        count = (FT_UInt)uVar25;
        if (*local_c338 == '\0') break;
        pcVar20 = local_c338 + -1;
        do {
          pcVar1 = pcVar20 + 1;
          pcVar20 = pcVar20 + 1;
        } while (*pcVar1 == ' ');
        local_c338 = af_shaper_get_cluster(pcVar20,&metrics->root,pvVar17,&num_idx_1);
        uVar16 = num_idx_1;
        if (num_idx_1 != 0) {
          uVar3 = pAVar51->properties;
          lVar52 = -0x80000000;
          if ((uVar3 & 1) == 0) {
            lVar52 = 0x7fffffff;
          }
          bVar12 = false;
          uVar29 = 0;
LAB_001773bc:
          if (uVar29 != uVar16) {
            FVar19 = af_shaper_get_elem(pAVar18,pvVar17,uVar29,(FT_Long *)0x0,&y_offset);
            if (((FVar19 != 0) && (FVar15 = FT_Load_Glyph(face,(FT_UInt)FVar19,1), FVar15 == 0)) &&
               (pFVar4 = face->glyph, 2 < (pFVar4->outline).n_points)) {
              pFVar5 = (pFVar4->outline).points;
              pcVar20 = (pFVar4->outline).tags;
              uVar50._0_2_ = (pFVar4->outline).n_contours;
              uVar50._2_2_ = (pFVar4->outline).n_points;
              uVar26 = 0;
              uVar53 = (ulong)uVar50;
              if ((short)(undefined2)uVar50 < 1) {
                uVar53 = uVar26;
              }
              lVar8 = CONCAT44(y_offset._4_4_,(uint)y_offset);
              lVar41 = 0;
              uVar50 = 0;
              local_c3cc = 0;
              local_c3d0 = 0;
              uVar46 = 0xffffffffffffffff;
              for (; uVar24 = (uint)uVar46, uVar26 != (uVar53 & 0xffff); uVar26 = uVar26 + 1) {
                uVar49 = (uint)(pFVar4->outline).contours[uVar26];
                if ((int)uVar50 < (int)uVar49) {
                  uVar48 = (ulong)(int)uVar50;
                  if ((uVar3 & 3) == 0) {
                    pFVar43 = &pFVar5[uVar48].y;
                    uVar46 = uVar46 & 0xffffffff;
                    for (; uVar31 = (uint)uVar46, (long)uVar48 <= (long)(int)uVar49;
                        uVar48 = uVar48 + 1) {
                      lVar6 = *pFVar43;
                      lVar2 = lVar6 + lVar8;
                      if (((int)uVar31 < 0) || (lVar6 < lVar41)) {
                        if (lVar2 <= lVar36) {
                          lVar36 = lVar2;
                        }
                        uVar46 = uVar48 & 0xffffffff;
                        lVar41 = lVar6;
                      }
                      else if (lVar33 <= lVar2) {
                        lVar33 = lVar2;
                      }
                      pFVar43 = pFVar43 + 2;
                    }
                  }
                  else {
                    pFVar43 = &pFVar5[uVar48].y;
                    uVar46 = uVar46 & 0xffffffff;
                    for (; uVar31 = (uint)uVar46, (long)uVar48 <= (long)(int)uVar49;
                        uVar48 = uVar48 + 1) {
                      lVar6 = *pFVar43;
                      lVar2 = lVar6 + lVar8;
                      if (((int)uVar31 < 0) || (lVar41 < lVar6)) {
                        if (lVar33 <= lVar2) {
                          lVar33 = lVar2;
                        }
                        uVar46 = uVar48 & 0xffffffff;
                        lVar41 = lVar6;
                      }
                      else if (lVar2 <= lVar36) {
                        lVar36 = lVar2;
                      }
                      pFVar43 = pFVar43 + 2;
                    }
                  }
                  if (uVar31 != uVar24) {
                    local_c3d0 = uVar50;
                    local_c3cc = uVar49;
                  }
                  uVar46 = (ulong)uVar31;
                }
                uVar50 = uVar49 + 1;
              }
              if (-1 < (int)uVar24) {
                lVar2 = pFVar5[uVar46 & 0xffffffff].x;
                uVar53 = 0xffffffffffffffff;
                if ((pcVar20[uVar46 & 0xffffffff] & 3U) == 1) {
                  uVar53 = uVar46;
                }
                uVar53 = uVar53 & 0xffffffff;
                uVar48 = uVar46 & 0xffffffff;
                uVar26 = uVar53;
                do {
                  uVar50 = (uint)uVar48;
                  uVar49 = uVar50 - 1;
                  if ((int)uVar50 <= (int)local_c3d0) {
                    uVar49 = local_c3cc;
                  }
                  uVar44 = pFVar5[(int)uVar49].y - lVar41;
                  uVar48 = -uVar44;
                  if (0 < (long)uVar44) {
                    uVar48 = uVar44;
                  }
                  if (5 < uVar48) {
                    uVar40 = pFVar5[(int)uVar49].x - lVar2;
                    uVar44 = -uVar40;
                    if (0 < (long)uVar40) {
                      uVar44 = uVar40;
                    }
                    if (uVar44 <= uVar48 * 0x14) break;
                  }
                  uVar50 = (uint)uVar53;
                  if ((int)(uint)uVar53 < 0) {
                    uVar50 = uVar49;
                  }
                  if ((pcVar20[(int)uVar49] & 3U) == 1) {
                    uVar26 = (ulong)uVar49;
                    uVar53 = (ulong)uVar50;
                  }
                  uVar48 = (ulong)uVar49;
                  uVar50 = uVar24;
                } while (uVar49 != uVar24);
                uVar48 = uVar46 & 0xffffffff;
                do {
                  uVar31 = (uint)uVar26;
                  uVar47 = (uint)uVar53;
                  uVar49 = (int)uVar48 + 1;
                  if ((int)local_c3cc <= (int)uVar48) {
                    uVar49 = local_c3d0;
                  }
                  uVar40 = pFVar5[(int)uVar49].y - lVar41;
                  uVar44 = -uVar40;
                  if (0 < (long)uVar40) {
                    uVar44 = uVar40;
                  }
                  if (5 < uVar44) {
                    uVar45 = pFVar5[(int)uVar49].x - lVar2;
                    uVar40 = -uVar45;
                    if (0 < (long)uVar45) {
                      uVar40 = uVar45;
                    }
                    if (uVar40 <= uVar44 * 0x14) goto LAB_00177695;
                  }
                  if ((int)uVar31 < 0) {
                    uVar31 = uVar49;
                  }
                  bVar54 = (pcVar20[(int)uVar49] & 3U) == 1;
                  if (bVar54) {
                    uVar26 = (ulong)uVar31;
                  }
                  uVar31 = (uint)uVar26;
                  if (bVar54) {
                    uVar53 = (ulong)uVar49;
                  }
                  uVar47 = (uint)uVar53;
                  uVar48 = (ulong)uVar49;
                } while (uVar49 != uVar24);
                uVar48 = uVar46 & 0xffffffff;
LAB_00177695:
                uVar23 = (uint)uVar48;
                uVar39 = uVar50;
                if ((uVar3 & 0x10) != 0) {
                  uVar53 = (ulong)metrics->units_per_em / 0x19;
                  uVar44 = pFVar5[(int)uVar23].x - pFVar5[(int)uVar50].x;
                  uVar26 = -uVar44;
                  if (0 < (long)uVar44) {
                    uVar26 = uVar44;
                  }
                  if ((uVar26 < uVar53) &&
                     ((int)((uVar23 - uVar50) + 2) <= (int)(local_c3cc - local_c3d0))) {
                    uVar46 = uVar46 & 0xffffffff;
                    do {
                      uVar11 = (int)uVar46 - 1;
                      if ((int)uVar46 <= (int)local_c3d0) {
                        uVar11 = local_c3cc;
                      }
                      uVar46 = (ulong)uVar11;
                      lVar6 = pFVar5[(int)uVar11].x;
                    } while ((lVar6 == lVar2) && (uVar11 != uVar24));
                    if (uVar11 == uVar24) goto LAB_00177568;
                    bVar54 = false;
                    local_c3a0 = 0;
                    local_c3a4 = 0;
                    local_c37c = uVar23;
                    do {
                      uVar24 = (uint)uVar48;
                      if (bVar54) {
                        lVar35 = (long)(int)local_c37c;
                      }
                      else {
                        lVar35 = (long)(int)uVar24;
                        local_c3a4 = 0xffffffff;
                        local_c3a0 = 0xffffffff;
                        local_c37c = uVar24;
                        if ((pcVar20[lVar35] & 3U) == 1) {
                          local_c3a4 = uVar24;
                          local_c3a0 = uVar24;
                        }
                      }
                      uVar11 = uVar24 + 1;
                      if ((int)local_c3cc <= (int)uVar24) {
                        uVar11 = local_c3d0;
                      }
                      uVar48 = (ulong)uVar11;
                      lVar7 = pFVar5[lVar35].y;
                      uVar46 = lVar41 - lVar7;
                      uVar26 = -uVar46;
                      if (0 < (long)uVar46) {
                        uVar26 = uVar46;
                      }
                      local_c320 = uVar53;
                      local_c318 = lVar6;
                      if (metrics->units_per_em >> 2 < uVar26) {
                        bVar54 = false;
                      }
                      else {
                        local_c2f8 = (long)(int)uVar11;
                        local_c2f0 = pFVar5[local_c2f8].x;
                        uVar46 = pFVar5[local_c2f8].y - lVar7;
                        uVar26 = -uVar46;
                        if (0 < (long)uVar46) {
                          uVar26 = uVar46;
                        }
                        lVar35 = pFVar5[lVar35].x;
                        uVar44 = local_c2f0 - lVar35;
                        uVar46 = -uVar44;
                        if (0 < (long)uVar44) {
                          uVar46 = uVar44;
                        }
                        uVar44 = uVar26 * 0x14;
                        local_c330 = uVar48;
                        local_c300 = lVar7;
                        if ((uVar26 < 6) || (uVar44 < uVar46)) {
                          uVar24 = local_c3a0;
                          if ((int)local_c3a0 < 0) {
                            uVar24 = uVar11;
                          }
                          if ((pcVar20[local_c2f8] & 3U) == 1) {
                            local_c3a4 = uVar11;
                            local_c3a0 = uVar24;
                          }
                          bVar54 = true;
                          local_c308 = uVar44;
                          if ((lVar35 < local_c2f0 == lVar6 < lVar2) && (uVar53 <= uVar46)) {
                            uVar53 = (ulong)local_c3a4;
                            uVar31 = local_c3a0;
                            goto LAB_00177a0b;
                          }
                        }
                        else {
                          bVar54 = false;
                        }
                      }
                    } while (uVar11 != uVar50);
                  }
                }
                goto LAB_00177912;
              }
              goto LAB_00177955;
            }
            goto LAB_00177568;
          }
          if ((lVar52 != -0x80000000) && (lVar52 != 0x7fffffff)) {
            if (bVar12) {
              pAVar21 = (AF_LatinMetricsRec *)hints;
              pAVar18 = (AF_StyleMetrics_conflict)(ulong)(count_00 + 1);
              count = count_00;
            }
            else {
              pAVar21 = dummy;
              uVar25 = (ulong)(count + 1);
            }
            *(long *)((long)pAVar21->axis[0].widths + (ulong)count * 8 + -0x68) = lVar52;
          }
        }
      }
      if (count != 0 || count_00 != 0) {
        af_sort_pos(count_00,(FT_Pos *)hints);
        af_sort_pos(count,(FT_Pos *)dummy);
        uVar16 = metrics->axis[1].blue_count;
        pAVar30 = local_c340 + uVar16;
        metrics->axis[1].blue_count = uVar16 + 1;
        uVar3 = pAVar51->properties;
        if (count == 0) {
          lVar52 = *(long *)((long)hints[0].axis[0].embedded.segments +
                            (ulong)(count_00 >> 1) * 8 + -0x70);
LAB_00177ba4:
          (pAVar30->shoot).org = lVar52;
          (pAVar30->ref).org = lVar52;
        }
        else {
          lVar52 = *(long *)((long)dummy[0].axis[0].widths + (uVar25 >> 1) * 8 + -0x68);
          if (count_00 == 0) goto LAB_00177ba4;
          (pAVar30->ref).org = lVar52;
          lVar8 = *(long *)((long)hints[0].axis[0].embedded.segments +
                           (ulong)(count_00 >> 1) * 8 + -0x70);
          (pAVar30->shoot).org = lVar8;
          if ((lVar8 != lVar52) && (lVar8 <= lVar52 == ((uVar3 & 3) != 0))) {
            lVar52 = (lVar8 + lVar52) / 2;
            goto LAB_00177ba4;
          }
        }
        pAVar30->ascender = lVar33;
        pAVar30->descender = lVar36;
        uVar16 = (uint)uVar3 + (uint)uVar3 & 0xe;
        pAVar30->flags = uVar16;
        if ((uVar3 & 8) != 0) {
          pAVar30->flags = uVar16 | 0x10;
        }
      }
      pAVar51 = pAVar51 + 1;
    }
    hb_buffer_destroy();
    uVar29 = metrics->axis[1].blue_count;
    if ((ulong)uVar29 != 0) {
      pAVar30 = local_c340;
      for (uVar25 = 0; uVar29 != uVar25; uVar25 = uVar25 + 1) {
        local_c2e0[uVar25 - 1] = (long)pAVar30;
        pAVar30 = pAVar30 + 1;
      }
      for (; uVar50 = uVar16, uVar16 != uVar29; uVar16 = uVar16 + 1) {
        while (uVar24 = uVar50 - 1, uVar50 != 0) {
          plVar38 = (long *)local_c2e0[(ulong)uVar24 - 1];
          plVar37 = plVar38;
          if ((*(byte *)(plVar38 + 8) & 6) == 0) {
            plVar37 = plVar38 + 3;
          }
          plVar9 = (long *)local_c2e0[(ulong)uVar50 - 1];
          plVar42 = plVar9 + 3;
          if ((*(byte *)(plVar9 + 8) & 6) != 0) {
            plVar42 = plVar9;
          }
          if (*plVar37 <= *plVar42) break;
          local_c2e0[(ulong)uVar50 - 1] = (long)plVar38;
          local_c2e0[(ulong)uVar24 - 1] = (long)plVar9;
          uVar50 = uVar24;
        }
      }
      for (uVar25 = 0; uVar29 - 1 != uVar25; uVar25 = uVar25 + 1) {
        lVar33 = local_c2e0[uVar25 - 1];
        lVar36 = 0x18;
        if ((*(byte *)(lVar33 + 0x40) & 6) == 0) {
          lVar36 = 0;
        }
        plVar38 = (long *)local_c2e0[uVar25];
        if ((*(byte *)(plVar38 + 8) & 6) != 0) {
          plVar38 = plVar38 + 3;
        }
        if (*plVar38 < *(long *)(lVar33 + lVar36)) {
          *(long *)(lVar33 + lVar36) = *plVar38;
        }
      }
    }
    hints[0].memory = (FT_Memory)0x0;
    dummy[0].root.style_class._0_1_ = '0';
    dummy[0].root.style_class._1_1_ = ' ';
    dummy[0].root.style_class._2_1_ = '1';
    dummy[0].root.style_class._3_1_ = ' ';
    dummy[0].root.style_class._4_1_ = '2';
    dummy[0].root.style_class._5_1_ = ' ';
    dummy[0].root.style_class._6_1_ = '3';
    dummy[0].root.style_class._7_1_ = ' ';
    dummy[0].root.scaler.face = (FT_Face)0x2037203620352034;
    dummy[0].root.scaler.x_scale = CONCAT44(dummy[0].root.scaler.x_scale._4_4_,0x392038);
    bVar12 = true;
    pvVar17 = (void *)hb_buffer_create();
    pFVar32 = (FT_Memory)0x0;
    pAVar21 = dummy;
    do {
      while( true ) {
        do {
          metrics_01 = pAVar21;
          if (*(char *)&(metrics_01->root).style_class == '\0') {
            bVar12 = true;
            goto LAB_00177d54;
          }
          pAVar21 = (AF_LatinMetricsRec *)
                    af_shaper_get_cluster
                              ((char *)metrics_01,&metrics->root,pvVar17,(uint *)&y_offset);
        } while ((1 < (uint)y_offset) ||
                (FVar19 = af_shaper_get_elem(&metrics_01->root,pvVar17,0,(FT_Long *)hints,
                                             (FT_Long *)0x0), FVar19 == 0));
        if (!bVar12) break;
        bVar12 = false;
        pFVar32 = hints[0].memory;
      }
      bVar12 = false;
    } while (hints[0].memory == pFVar32);
LAB_00177d54:
    hb_buffer_destroy(pvVar17);
    (metrics->root).digits_have_same_width = bVar12;
    charmap = local_c328;
  }
  FT_Set_Charmap(face,charmap);
  return 0;
  while( true ) {
    uVar47 = uVar31;
    if ((int)uVar31 < 0) {
      uVar47 = uVar24;
    }
    if ((pcVar20[(int)uVar24] & 3U) == 1) {
      uVar31 = uVar47;
    }
    uVar53 = uVar48;
    uVar47 = uVar50;
    uVar23 = uVar50;
    if (uVar24 == uVar50) break;
LAB_00177a0b:
    uVar24 = (int)uVar48 + 1;
    if ((int)local_c3cc <= (int)uVar48) {
      uVar24 = local_c3d0;
    }
    uVar48 = (ulong)uVar24;
    uVar46 = pFVar5[(int)uVar24].y - lVar7;
    uVar26 = -uVar46;
    if (0 < (long)uVar46) {
      uVar26 = uVar46;
    }
    lVar41 = lVar7;
    uVar39 = local_c37c;
    if (5 < uVar26) {
      uVar46 = pFVar5[(int)uVar49].x - lVar35;
      uVar26 = -uVar46;
      if (0 < (long)uVar46) {
        uVar26 = uVar46;
      }
      if (uVar26 <= uVar44) {
        uVar47 = (uint)uVar53;
        uVar23 = local_c3cc;
        if ((int)local_c3d0 < (int)uVar24) {
          uVar23 = uVar24 - 1;
        }
        break;
      }
    }
  }
LAB_00177912:
  lVar41 = lVar41 + lVar8;
  if (((int)uVar31 < 0) || ((int)uVar47 < 0)) {
LAB_00177969:
    if ((pcVar20[(int)uVar39] & 3U) == 1) {
      bVar55 = (pcVar20[(int)uVar23] & 3U) == 1;
      bVar54 = !bVar55;
      if (bVar55) goto LAB_001779bb;
    }
    else {
      bVar54 = true;
    }
    if ((uVar3 & 4) != 0) goto LAB_00177568;
  }
  else {
    uVar26 = pFVar5[uVar47].x - pFVar5[uVar31].x;
    uVar53 = -uVar26;
    if (0 < (long)uVar26) {
      uVar53 = uVar26;
    }
    if (uVar53 <= local_c310) goto LAB_00177969;
LAB_00177955:
    bVar54 = false;
  }
LAB_001779bb:
  if ((uVar3 & 1) == 0) {
    if (lVar41 < lVar52) {
      lVar52 = lVar41;
      bVar12 = bVar54;
    }
  }
  else if (lVar52 < lVar41) {
    lVar52 = lVar41;
    bVar12 = bVar54;
  }
LAB_00177568:
  uVar29 = uVar29 + 1;
  goto LAB_001773bc;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_latin_metrics_init( AF_LatinMetrics  metrics,
                         FT_Face          face )
  {
    FT_CharMap  oldmap = face->charmap;


    metrics->units_per_em = face->units_per_EM;

    if ( !FT_Select_Charmap( face, FT_ENCODING_UNICODE ) )
    {
      af_latin_metrics_init_widths( metrics, face );
      af_latin_metrics_init_blues( metrics, face );
      af_latin_metrics_check_digits( metrics, face );
    }

    FT_Set_Charmap( face, oldmap );
    return FT_Err_Ok;
  }